

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

bool __thiscall
DReachabilityPropagator::correctDominator
          (DReachabilityPropagator *this,int r,vector<bool,_std::allocator<bool>_> *v,int avoid)

{
  ulong *puVar1;
  uint uVar2;
  pointer pvVar3;
  uint *puVar4;
  BoolView *pBVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  
  if (r != avoid) {
    uVar6 = (ulong)r;
    uVar8 = uVar6 + 0x3f;
    if (-1 < (long)uVar6) {
      uVar8 = uVar6;
    }
    puVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p +
             ((long)uVar8 >> 6) +
             (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    *puVar1 = *puVar1 | 1L << ((byte)r & 0x3f);
    pvVar3 = (this->ou).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (uint *)pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar9 = *(uint **)&pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data; puVar9 != puVar4; puVar9 = puVar9 + 1) {
      uVar2 = *puVar9;
      pBVar5 = (this->super_GraphPropagator).es.data;
      if ((sat.assigns.data[(uint)pBVar5[uVar2].v] == '\0') ||
         ((uint)pBVar5[uVar2].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar5[uVar2].v])) {
        pBVar5 = (this->super_GraphPropagator).vs.data;
        uVar2 = *(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + 4);
        uVar8 = (ulong)uVar2;
        if (sat.assigns.data[(uint)pBVar5[uVar8].v] == '\0') {
          if (uVar2 != avoid) goto LAB_001ce952;
        }
        else if ((uVar2 != avoid) &&
                ((uint)pBVar5[uVar8].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar5[uVar8].v])) {
LAB_001ce952:
          uVar7 = (ulong)(int)uVar2;
          uVar6 = uVar7 + 0x3f;
          if (-1 < (long)uVar7) {
            uVar6 = uVar7;
          }
          if (((v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [((long)uVar6 >> 6) +
                (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar7 & 0x3f) & 1) == 0) {
            (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xf])
                      (this,uVar8,v,(ulong)(uint)avoid);
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool DReachabilityPropagator::correctDominator(int r, std::vector<bool>& v, int avoid) {
	if (r == avoid) {
		return true;
	}
	v[r] = true;
	if (DEBUG) {
		std::cout << "Visiting " << r << " " << avoid << " who is "
							<< (getNodeVar(r).isFixed() ? (getNodeVar(r).isTrue() ? "in" : "out") : "unfixed")
							<< '\n';
	}
	for (const int e : ou[r]) {
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int o = getHead(e);
		if (getNodeVar(o).isFixed() && getNodeVar(o).isFalse()) {
			continue;
		}
		if (o == avoid) {
			continue;
		}
		if (v[o]) {
			continue;
		}
		correctDominator(o, v, avoid);
	}
	return true;
}